

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_join(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int toLocaleString)

{
  JSValue this_obj;
  JSValue v;
  int iVar1;
  int in_ECX;
  JSValue *in_R8;
  int in_R9D;
  JSValue JVar2;
  int c;
  int64_t n;
  int64_t i;
  JSString *p;
  StringBuffer *b;
  StringBuffer b_s;
  JSValue el;
  JSValue sep;
  JSValue obj;
  JSValue in_stack_ffffffffffffff08;
  JSContext *pJVar3;
  JSValue in_stack_ffffffffffffff18;
  JSValueUnion in_stack_ffffffffffffff28;
  JSValueUnion in_stack_ffffffffffffff30;
  JSValueUnion JVar4;
  uint local_b4;
  long local_b0;
  long local_a8;
  JSValueUnion JVar5;
  int64_t in_stack_ffffffffffffffb0;
  JSValueUnion local_10;
  int64_t local_8;
  
  JVar2.tag = in_stack_ffffffffffffffb0;
  JVar2.u.float64 = 1.48219693752374e-323;
  JVar2 = JS_ToObject((JSContext *)0x0,JVar2);
  JVar4 = JVar2.u;
  iVar1 = js_get_length64((JSContext *)in_stack_ffffffffffffff30.ptr,
                          (int64_t *)in_stack_ffffffffffffff28.ptr,JVar2);
  pJVar3 = (JSContext *)in_stack_ffffffffffffff08.tag;
  if (iVar1 == 0) {
    local_b4 = 0x2c;
    if (((in_R9D == 0) && (0 < in_ECX)) && (iVar1 = JS_IsUndefined(*in_R8), iVar1 == 0)) {
      JVar2 = JS_ToString((JSContext *)0x1b0a81,in_stack_ffffffffffffff08);
      in_stack_ffffffffffffff28 = JVar2.u;
      in_stack_ffffffffffffff30 = (JSValueUnion)JVar2.tag;
      JVar5 = in_stack_ffffffffffffff28;
      iVar1 = JS_IsException(JVar2);
      pJVar3 = (JSContext *)in_stack_ffffffffffffff08.tag;
      if (iVar1 != 0) goto LAB_001b0d20;
      if ((((uint)*(undefined8 *)((long)JVar5.ptr + 4) & 0x7fffffff) == 1) &&
         ((*(ulong *)((long)JVar5.ptr + 4) >> 0x1f & 1) == 0)) {
        local_b4 = (uint)*(byte *)((long)JVar5.ptr + 0x10);
      }
      else {
        local_b4 = 0xffffffff;
      }
    }
    string_buffer_init((JSContext *)in_stack_ffffffffffffff08.tag,
                       (StringBuffer *)in_stack_ffffffffffffff08.u.ptr,0);
    for (local_a8 = 0; pJVar3 = (JSContext *)in_stack_ffffffffffffff08.tag, local_a8 < local_b0;
        local_a8 = local_a8 + 1) {
      if (0 < local_a8) {
        if ((int)local_b4 < 0) {
          string_buffer_concat
                    ((StringBuffer *)in_stack_ffffffffffffff18.u.ptr,(JSString *)pJVar3,
                     in_stack_ffffffffffffff08.u._4_4_,in_stack_ffffffffffffff08.u._0_4_);
        }
        else {
          string_buffer_putc8((StringBuffer *)in_stack_ffffffffffffff08.u.ptr,0);
        }
      }
      this_obj.tag = (int64_t)in_stack_ffffffffffffff30.ptr;
      this_obj.u.float64 = in_stack_ffffffffffffff28.float64;
      JVar2 = JS_GetPropertyUint32
                        ((JSContext *)in_stack_ffffffffffffff18.tag,this_obj,
                         in_stack_ffffffffffffff18.u._4_4_);
      in_stack_ffffffffffffff18 = JVar2;
      iVar1 = JS_IsException(JVar2);
      pJVar3 = (JSContext *)in_stack_ffffffffffffff08.tag;
      if (iVar1 != 0) {
LAB_001b0cf9:
        string_buffer_free((StringBuffer *)0x1b0d03);
        JS_FreeValue(pJVar3,in_stack_ffffffffffffff18);
        goto LAB_001b0d20;
      }
      iVar1 = JS_IsNull(JVar2);
      if ((iVar1 == 0) && (iVar1 = JS_IsUndefined(JVar2), iVar1 == 0)) {
        if (in_R9D != 0) {
          in_stack_ffffffffffffff08 =
               JS_ToLocaleStringFree((JSContext *)0x1b0c49,in_stack_ffffffffffffff08);
        }
        v.tag = (int64_t)JVar4.ptr;
        v.u.float64 = in_stack_ffffffffffffff30.float64;
        iVar1 = string_buffer_concat_value_free((StringBuffer *)in_stack_ffffffffffffff28.ptr,v);
        pJVar3 = (JSContext *)in_stack_ffffffffffffff08.tag;
        if (iVar1 != 0) goto LAB_001b0cf9;
      }
    }
    JS_FreeValue(pJVar3,in_stack_ffffffffffffff18);
    JS_FreeValue(pJVar3,in_stack_ffffffffffffff18);
    _local_10 = string_buffer_end((StringBuffer *)pJVar3);
  }
  else {
LAB_001b0d20:
    JS_FreeValue(pJVar3,in_stack_ffffffffffffff18);
    local_10.ptr = (void *)(local_10 << 0x20);
    local_8 = 6;
  }
  return _local_10;
}

Assistant:

static JSValue js_array_join(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int toLocaleString)
{
    JSValue obj, sep = JS_UNDEFINED, el;
    StringBuffer b_s, *b = &b_s;
    JSString *p = NULL;
    int64_t i, n;
    int c;

    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &n, obj))
        goto exception;

    c = ',';    /* default separator */
    if (!toLocaleString && argc > 0 && !JS_IsUndefined(argv[0])) {
        sep = JS_ToString(ctx, argv[0]);
        if (JS_IsException(sep))
            goto exception;
        p = JS_VALUE_GET_STRING(sep);
        if (p->len == 1 && !p->is_wide_char)
            c = p->u.str8[0];
        else
            c = -1;
    }
    string_buffer_init(ctx, b, 0);

    for(i = 0; i < n; i++) {
        if (i > 0) {
            if (c >= 0) {
                string_buffer_putc8(b, c);
            } else {
                string_buffer_concat(b, p, 0, p->len);
            }
        }
        el = JS_GetPropertyUint32(ctx, obj, i);
        if (JS_IsException(el))
            goto fail;
        if (!JS_IsNull(el) && !JS_IsUndefined(el)) {
            if (toLocaleString) {
                el = JS_ToLocaleStringFree(ctx, el);
            }
            if (string_buffer_concat_value_free(b, el))
                goto fail;
        }
    }
    JS_FreeValue(ctx, sep);
    JS_FreeValue(ctx, obj);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
    JS_FreeValue(ctx, sep);
exception:
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}